

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_inverse_scalar(secp256k1_scalar *out,secp256k1_scalar *x,int var)

{
  ulong uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  ulong uVar38;
  undefined4 uVar39;
  uint uVar40;
  int iVar41;
  uint extraout_EAX;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  secp256k1_fe *r_00;
  secp256k1_fe *r_01;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  code *pcVar61;
  code *pcVar62;
  uint extraout_XMM0_Da;
  uint uVar63;
  uint extraout_XMM0_Db;
  uint uVar65;
  uint extraout_XMM0_Dc;
  uint uVar66;
  undefined1 auVar64 [16];
  uint extraout_XMM0_Dd;
  uint uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  secp256k1_scalar l;
  secp256k1_scalar r;
  secp256k1_scalar t;
  uchar auStack_120 [40];
  secp256k1_fe *psStack_f8;
  secp256k1_fe *psStack_e0;
  code *pcStack_d8;
  secp256k1_scalar *psStack_d0;
  code *local_c0;
  undefined1 local_b8 [32];
  secp256k1_fe local_98;
  undefined1 local_68 [16];
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  pcVar61 = secp256k1_scalar_inverse_var;
  if (var == 0) {
    pcVar61 = secp256k1_scalar_inverse;
  }
  r_00 = (secp256k1_fe *)local_b8;
  psStack_d0 = (secp256k1_scalar *)0x157d58;
  r_01 = r_00;
  uVar39 = (*pcVar61)();
  if (out != (secp256k1_scalar *)0x0) {
    out->d[2] = CONCAT44(local_b8._20_4_,local_b8._16_4_);
    out->d[3] = CONCAT44(local_b8._28_4_,local_b8._24_4_);
    out->d[0] = CONCAT44(local_b8._4_4_,local_b8._0_4_);
    out->d[1] = CONCAT44(local_b8._12_4_,local_b8._8_4_);
  }
  uVar63 = 0;
  uVar65 = 0;
  uVar66 = 0;
  uVar67 = 0;
  auVar68._0_4_ = -(uint)((int)x->d[2] == 0 && (int)x->d[0] == 0);
  auVar68._4_4_ = -(uint)(*(int *)((long)x->d + 0x14) == 0 && *(int *)((long)x->d + 4) == 0);
  auVar68._8_4_ = -(uint)((int)x->d[3] == 0 && (int)x->d[1] == 0);
  auVar68._12_4_ = -(uint)(*(int *)((long)x->d + 0x1c) == 0 && *(int *)((long)x->d + 0xc) == 0);
  uVar40 = movmskps(uVar39,auVar68);
  uVar40 = uVar40 ^ 0xf;
  if (uVar40 != 0) {
    uVar43 = x->d[0];
    uVar44 = x->d[1];
    uVar1 = x->d[2];
    uVar50 = CONCAT44(local_b8._4_4_,local_b8._0_4_);
    uVar55 = CONCAT44(local_b8._12_4_,local_b8._8_4_);
    uVar38 = CONCAT44(local_b8._20_4_,local_b8._16_4_);
    out = (secp256k1_scalar *)CONCAT44(local_b8._28_4_,local_b8._24_4_);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar43;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar50;
    uVar45 = SUB168(auVar3 * auVar19,8);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar45;
    local_98.n[0] = SUB168(auVar3 * auVar19,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar43;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar55;
    auVar4 = auVar4 * auVar20;
    uVar51 = SUB168(auVar4 + auVar37,0);
    uVar53 = SUB168(auVar4 + auVar37,8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar44;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar50;
    uVar46 = SUB168(auVar5 * auVar21,8);
    uVar42 = SUB168(auVar5 * auVar21,0);
    local_98.n[1] = uVar51 + uVar42;
    uVar42 = (ulong)CARRY8(uVar51,uVar42);
    uVar51 = uVar53 + uVar46;
    uVar54 = uVar51 + uVar42;
    uVar56 = (ulong)CARRY8(auVar4._8_8_,(ulong)CARRY8(uVar45,auVar4._0_8_)) +
             (ulong)(CARRY8(uVar53,uVar46) || CARRY8(uVar51,uVar42));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar43;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar38;
    uVar47 = SUB168(auVar6 * auVar22,8);
    uVar42 = SUB168(auVar6 * auVar22,0);
    uVar45 = uVar54 + uVar42;
    uVar42 = (ulong)CARRY8(uVar54,uVar42);
    uVar46 = uVar56 + uVar47;
    uVar57 = uVar46 + uVar42;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar44;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar55;
    uVar48 = SUB168(auVar7 * auVar23,8);
    uVar51 = SUB168(auVar7 * auVar23,0);
    uVar54 = uVar45 + uVar51;
    uVar51 = (ulong)CARRY8(uVar45,uVar51);
    uVar53 = uVar57 + uVar48;
    uVar58 = uVar53 + uVar51;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar1;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar50;
    uVar49 = SUB168(auVar8 * auVar24,8);
    uVar45 = SUB168(auVar8 * auVar24,0);
    local_98.n[2] = uVar54 + uVar45;
    uVar45 = (ulong)CARRY8(uVar54,uVar45);
    uVar54 = uVar58 + uVar49;
    uVar59 = uVar54 + uVar45;
    uVar57 = (ulong)(CARRY8(uVar56,uVar47) || CARRY8(uVar46,uVar42)) +
             (ulong)(CARRY8(uVar57,uVar48) || CARRY8(uVar53,uVar51)) +
             (ulong)(CARRY8(uVar58,uVar49) || CARRY8(uVar54,uVar45));
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar43;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = out;
    uVar47 = SUB168(auVar9 * auVar25,8);
    uVar43 = SUB168(auVar9 * auVar25,0);
    uVar51 = uVar59 + uVar43;
    uVar43 = (ulong)CARRY8(uVar59,uVar43);
    uVar46 = uVar57 + uVar47;
    uVar58 = uVar46 + uVar43;
    pcVar62 = (code *)x->d[3];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar44;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar38;
    uVar48 = SUB168(auVar10 * auVar26,8);
    uVar42 = SUB168(auVar10 * auVar26,0);
    uVar45 = uVar51 + uVar42;
    uVar42 = (ulong)CARRY8(uVar51,uVar42);
    uVar53 = uVar58 + uVar48;
    uVar59 = uVar53 + uVar42;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar1;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar55;
    uVar49 = SUB168(auVar11 * auVar27,8);
    uVar51 = SUB168(auVar11 * auVar27,0);
    uVar60 = uVar45 + uVar51;
    uVar51 = (ulong)CARRY8(uVar45,uVar51);
    uVar54 = uVar59 + uVar49;
    uVar52 = uVar54 + uVar51;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = pcVar62;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar50;
    uVar56 = SUB168(auVar12 * auVar28,8);
    uVar45 = SUB168(auVar12 * auVar28,0);
    local_98.n[3] = uVar60 + uVar45;
    uVar45 = (ulong)CARRY8(uVar60,uVar45);
    uVar50 = uVar52 + uVar56;
    uVar60 = uVar50 + uVar45;
    uVar47 = (ulong)(CARRY8(uVar57,uVar47) || CARRY8(uVar46,uVar43)) +
             (ulong)(CARRY8(uVar58,uVar48) || CARRY8(uVar53,uVar42)) +
             (ulong)(CARRY8(uVar59,uVar49) || CARRY8(uVar54,uVar51)) +
             (ulong)(CARRY8(uVar52,uVar56) || CARRY8(uVar50,uVar45));
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar44;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = out;
    uVar53 = SUB168(auVar13 * auVar29,8);
    uVar43 = SUB168(auVar13 * auVar29,0);
    uVar42 = uVar60 + uVar43;
    uVar43 = (ulong)CARRY8(uVar60,uVar43);
    uVar51 = uVar47 + uVar53;
    uVar48 = uVar51 + uVar43;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar1;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar38;
    uVar54 = SUB168(auVar14 * auVar30,8);
    uVar44 = SUB168(auVar14 * auVar30,0);
    uVar46 = uVar42 + uVar44;
    uVar44 = (ulong)CARRY8(uVar42,uVar44);
    uVar45 = uVar48 + uVar54;
    uVar49 = uVar45 + uVar44;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = pcVar62;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar55;
    uVar50 = SUB168(auVar15 * auVar31,8);
    uVar42 = SUB168(auVar15 * auVar31,0);
    local_98.n[4] = uVar46 + uVar42;
    uVar42 = (ulong)CARRY8(uVar46,uVar42);
    uVar46 = uVar49 + uVar50;
    uVar55 = uVar46 + uVar42;
    uVar46 = (ulong)(CARRY8(uVar47,uVar53) || CARRY8(uVar51,uVar43)) +
             (ulong)(CARRY8(uVar48,uVar54) || CARRY8(uVar45,uVar44)) +
             (ulong)(CARRY8(uVar49,uVar50) || CARRY8(uVar46,uVar42));
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar1;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = out;
    uVar51 = SUB168(auVar16 * auVar32,8);
    uVar43 = SUB168(auVar16 * auVar32,0);
    uVar42 = uVar55 + uVar43;
    uVar43 = (ulong)CARRY8(uVar55,uVar43);
    uVar1 = uVar46 + uVar51;
    uVar53 = uVar1 + uVar43;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = pcVar62;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar38;
    uVar45 = SUB168(auVar17 * auVar33,8);
    uVar44 = SUB168(auVar17 * auVar33,0);
    local_98._40_8_ = uVar42 + uVar44;
    uVar44 = (ulong)CARRY8(uVar42,uVar44);
    uVar42 = uVar53 + uVar45;
    local_68._8_8_ =
         (ulong)(CARRY8(uVar46,uVar51) || CARRY8(uVar1,uVar43)) +
         (ulong)(CARRY8(uVar53,uVar45) || CARRY8(uVar42,uVar44));
    local_68._0_8_ = uVar42 + uVar44;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = pcVar62;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = out;
    local_68 = auVar18 * auVar34 + local_68;
    r_00 = (secp256k1_fe *)&local_50;
    psStack_d0 = (secp256k1_scalar *)0x157ef3;
    r_01 = r_00;
    local_c0 = pcVar61;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)r_00,(uint64_t *)(local_b8 + 0x20));
    if (((local_50 != 1 || local_48 != 0) || local_40 != 0) || local_38 != 0) {
      psStack_d0 = (secp256k1_scalar *)0x157fea;
      test_inverse_scalar_cold_1();
      goto LAB_00157fea;
    }
    psStack_d0 = (secp256k1_scalar *)0x157f23;
    iVar41 = secp256k1_scalar_add((secp256k1_scalar *)(local_b8 + 0x20),x,&scalar_minus_one);
    pcVar61 = local_c0;
    auVar64._0_4_ = -(uint)((int)local_98.n[2] == 0 && (int)local_98.n[0] == 0);
    auVar64._4_4_ = -(uint)(local_98.n[2]._4_4_ == 0 && local_98.n[0]._4_4_ == 0);
    auVar64._8_4_ = -(uint)((int)local_98.n[3] == 0 && (int)local_98.n[1] == 0);
    auVar64._12_4_ = -(uint)(local_98.n[3]._4_4_ == 0 && local_98.n[1]._4_4_ == 0);
    iVar41 = movmskps(iVar41,auVar64);
    if (iVar41 == 0xf) {
      return;
    }
    r_00 = (secp256k1_fe *)(local_b8 + 0x20);
    psStack_d0 = (secp256k1_scalar *)0x157f53;
    (*local_c0)(r_00,r_00);
    out = (secp256k1_scalar *)local_b8;
    psStack_d0 = (secp256k1_scalar *)0x157f6a;
    secp256k1_scalar_add(out,&scalar_minus_one,out);
    psStack_d0 = (secp256k1_scalar *)0x157f73;
    (*pcVar61)(out,out);
    psStack_d0 = (secp256k1_scalar *)0x157f85;
    secp256k1_scalar_add(out,out,&secp256k1_scalar_one);
    psStack_d0 = (secp256k1_scalar *)0x157f93;
    r_01 = (secp256k1_fe *)out;
    iVar41 = secp256k1_scalar_add(out,(secp256k1_scalar *)r_00,out);
    auVar69._0_4_ = -(uint)(local_b8._16_4_ == 0 && local_b8._0_4_ == 0);
    auVar69._4_4_ = -(uint)(local_b8._20_4_ == 0 && local_b8._4_4_ == 0);
    auVar69._8_4_ = -(uint)(local_b8._24_4_ == 0 && local_b8._8_4_ == 0);
    auVar69._12_4_ = -(uint)(local_b8._28_4_ == 0 && local_b8._12_4_ == 0);
    iVar41 = movmskps(iVar41,auVar69);
    if (iVar41 == 0xf) {
      return;
    }
    psStack_d0 = (secp256k1_scalar *)0x157fb7;
    test_inverse_scalar_cold_2();
    uVar40 = extraout_EAX;
    uVar63 = extraout_XMM0_Da;
    uVar65 = extraout_XMM0_Db;
    uVar66 = extraout_XMM0_Dc;
    uVar67 = extraout_XMM0_Dd;
  }
  auVar70._0_4_ = -(uint)((local_b8._16_4_ | local_b8._0_4_) == uVar63);
  auVar70._4_4_ = -(uint)((local_b8._20_4_ | local_b8._4_4_) == uVar65);
  auVar70._8_4_ = -(uint)((local_b8._24_4_ | local_b8._8_4_) == uVar66);
  auVar70._12_4_ = -(uint)((local_b8._28_4_ | local_b8._12_4_) == uVar67);
  iVar41 = movmskps(uVar40,auVar70);
  pcVar62 = pcVar61;
  if (iVar41 == 0xf) {
    return;
  }
LAB_00157fea:
  psStack_d0 = (secp256k1_scalar *)random_fe;
  test_inverse_scalar_cold_3();
  psStack_f8 = r_00;
  psStack_e0 = (secp256k1_fe *)out;
  pcStack_d8 = pcVar62;
  psStack_d0 = x;
  do {
    secp256k1_testrand256(auStack_120);
    secp256k1_fe_impl_set_b32_mod(r_01,auStack_120);
    bVar35 = (r_01->n[2] & r_01->n[3] & r_01->n[1]) == 0xfffffffffffff;
    bVar36 = r_01->n[4] == 0xffffffffffff;
    bVar2 = 0xffffefffffc2e < r_01->n[0];
    if (bVar2 && (bVar35 && bVar36)) {
      r_01->magnitude = -1;
    }
    else {
      r_01->magnitude = 1;
      r_01->normalized = 1;
      secp256k1_fe_verify(r_01);
    }
  } while (bVar2 && (bVar35 && bVar36));
  return;
}

Assistant:

static void test_inverse_scalar(secp256k1_scalar* out, const secp256k1_scalar* x, int var)
{
    secp256k1_scalar l, r, t;

    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&l, x);  /* l = 1/x */
    if (out) *out = l;
    if (secp256k1_scalar_is_zero(x)) {
        CHECK(secp256k1_scalar_is_zero(&l));
        return;
    }
    secp256k1_scalar_mul(&t, x, &l);                                             /* t = x*(1/x) */
    CHECK(secp256k1_scalar_is_one(&t));                                          /* x*(1/x) == 1 */
    secp256k1_scalar_add(&r, x, &scalar_minus_one);                              /* r = x-1 */
    if (secp256k1_scalar_is_zero(&r)) return;
    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&r, &r); /* r = 1/(x-1) */
    secp256k1_scalar_add(&l, &scalar_minus_one, &l);                             /* l = 1/x-1 */
    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&l, &l); /* l = 1/(1/x-1) */
    secp256k1_scalar_add(&l, &l, &secp256k1_scalar_one);                         /* l = 1/(1/x-1)+1 */
    secp256k1_scalar_add(&l, &r, &l);                                            /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_scalar_is_zero(&l));                                         /* l == 0 */
}